

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall
Atari::ST::ConcreteMachine::set_component_prefers_clocking
          (ConcreteMachine *this,Source *param_1,Preference param_2)

{
  Preference PVar1;
  bool bVar2;
  
  PVar1 = Motorola::ACIA::ACIA::preferred_clocking(&(this->keyboard_acia_).object_);
  if (PVar1 == RealTime) {
    bVar2 = false;
  }
  else {
    PVar1 = Motorola::ACIA::ACIA::preferred_clocking(&(this->midi_acia_).object_);
    bVar2 = PVar1 != RealTime;
  }
  this->may_defer_acias_ = bVar2;
  PVar1 = IntelligentKeyboard::preferred_clocking(&this->ikbd_);
  this->keyboard_needs_clock_ = PVar1 != None;
  PVar1 = Motorola::MFP68901::MFP68901::preferred_clocking(&(this->mfp_).object_);
  this->mfp_is_realtime_ = PVar1 == RealTime;
  PVar1 = DMAController::preferred_clocking(&(this->dma_).object_);
  this->dma_clocking_preference_ = PVar1;
  return;
}

Assistant:

void set_component_prefers_clocking(ClockingHint::Source *, ClockingHint::Preference) final {
			// This is being called by one of the components; avoid any time flushing here as that's
			// already dealt with (and, just to be absolutely sure, to avoid recursive mania).
			may_defer_acias_ =
				(keyboard_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime) &&
				(midi_acia_.last_valid()->preferred_clocking() != ClockingHint::Preference::RealTime);
			keyboard_needs_clock_ = ikbd_.preferred_clocking() != ClockingHint::Preference::None;
			mfp_is_realtime_ = mfp_.last_valid()->preferred_clocking() == ClockingHint::Preference::RealTime;
			dma_clocking_preference_ = dma_.last_valid()->preferred_clocking();
		}